

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O2

int patchtestreg(FuncState *fs,int node,int reg)

{
  Instruction *pIVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  
  pIVar1 = getjumpcontrol(fs,node);
  uVar4 = *pIVar1;
  iVar2 = 0;
  if ((uVar4 & 0x7f) == 0x43) {
    if ((reg == 0xff) || ((uVar4 >> 0x10 & 0xff) == reg)) {
      uVar3 = uVar4 >> 9 & 0x7f80;
      uVar4 = uVar4 & 0x8042;
    }
    else {
      uVar4 = uVar4 & 0xffff8043;
      uVar3 = (reg & 0xffU) << 7;
    }
    *pIVar1 = uVar4 | uVar3;
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

static int patchtestreg (FuncState *fs, int node, int reg) {
  Instruction *i = getjumpcontrol(fs, node);
  if (GET_OPCODE(*i) != OP_TESTSET)
    return 0;  /* cannot patch other instructions */
  if (reg != NO_REG && reg != GETARG_B(*i))
    SETARG_A(*i, reg);
  else {
     /* no register to put value or register already has the value;
        change instruction to simple test */
    *i = CREATE_ABCk(OP_TEST, GETARG_B(*i), 0, 0, GETARG_k(*i));
  }
  return 1;
}